

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helicsWebServer.cpp
# Opt level: O3

pair<std::basic_string_view<char,_std::char_traits<char>_>,_boost::container::flat_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_void>_>
* processRequestParameters_abi_cxx11_
            (pair<std::basic_string_view<char,_std::char_traits<char>_>,_boost::container::flat_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_void>_>
             *__return_storage_ptr__,string_view target,string_view body)

{
  long lVar1;
  flat_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_void>
  *this;
  bool bVar2;
  char __c;
  void *pvVar3;
  ulong uVar4;
  reference pbVar5;
  string_type *psVar6;
  mapped_type *this_00;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_boost::container::flat_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_void>_>
  *extraout_RAX;
  iterator iVar7;
  ulong uVar8;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_boost::container::flat_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_void>_>
  *extraout_RAX_00;
  ulong uVar9;
  char *pcVar10;
  size_type __n;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_boost::container::flat_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_void>_>
  *ppVar11;
  ulong uVar12;
  _Base_ptr p_Var13;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_boost::container::flat_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_void>_>
  *ppVar14;
  ulong uVar15;
  string_view jsonString;
  vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  parameters;
  json val;
  iteration_proxy_value<nlohmann::json_abi_v3_11_3::detail::iter_impl<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>
  __begin3;
  iteration_proxy_value<nlohmann::json_abi_v3_11_3::detail::iter_impl<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>
  __end3;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_boost::container::flat_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_void>_>
  *local_1c8;
  iterator iStack_1c0;
  basic_string_view<char,_std::char_traits<char>_> *local_1b8;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_boost::container::flat_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_void>_>
  *local_1b0;
  basic_string_view<char,_std::char_traits<char>_> local_1a8;
  basic_string_view<char,_std::char_traits<char>_> local_198;
  data local_188;
  undefined1 local_178 [16];
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_boost::container::flat_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_void>_>
  local_168 [2];
  flat_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_void>
  *local_108;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_boost::container::flat_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_void>_>
  *local_100;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_boost::container::flat_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_void>_>
  *local_f8;
  ulong local_f0;
  undefined1 local_e8 [32];
  string local_c8;
  iteration_proxy<nlohmann::json_abi_v3_11_3::detail::iter_impl<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>
  local_a8;
  undefined1 local_a0 [112];
  
  local_198._M_str = body._M_str;
  local_198._M_len = body._M_len;
  pcVar10 = target._M_str;
  uVar12 = target._M_len;
  (__return_storage_ptr__->second).m_flat_tree.m_data.m_seq.m_holder.m_start = (pointer)0x0;
  (__return_storage_ptr__->second).m_flat_tree.m_data.m_seq.m_holder.m_size = 0;
  (__return_storage_ptr__->first)._M_len = 0;
  (__return_storage_ptr__->first)._M_str = (char *)0x0;
  (__return_storage_ptr__->second).m_flat_tree.m_data.m_seq.m_holder.m_capacity = 0;
  local_1b0 = __return_storage_ptr__;
  local_1a8._M_len = uVar12;
  local_1a8._M_str = pcVar10;
  if (uVar12 == 0) {
LAB_001c552e:
    (local_1b0->first)._M_len = local_1a8._M_len;
    (local_1b0->first)._M_str = local_1a8._M_str;
    local_1a8._M_len = 0;
    local_1a8._M_str = (char *)0x0;
    uVar9 = (local_1b0->first)._M_len;
  }
  else {
    pvVar3 = memchr(pcVar10,0x3f,uVar12);
    uVar4 = (long)pvVar3 - (long)pcVar10;
    if (uVar4 == 0xffffffffffffffff || pvVar3 == (void *)0x0) goto LAB_001c552e;
    uVar9 = uVar4;
    if (uVar12 < uVar4) {
      uVar9 = uVar12;
    }
    (local_1b0->first)._M_len = uVar9;
    (local_1b0->first)._M_str = pcVar10;
    lVar1 = uVar4 + 1;
    if (uVar12 <= uVar4) {
      std::__throw_out_of_range_fmt
                ("%s: __pos (which is %zu) > __size (which is %zu)","basic_string_view::substr",
                 lVar1,uVar12);
    }
    local_1a8._M_len = uVar12 - lVar1;
    local_1a8._M_str = pcVar10 + lVar1;
  }
  p_Var13 = (_Base_ptr)local_1a8._M_str;
  ppVar11 = (pair<std::basic_string_view<char,_std::char_traits<char>_>,_boost::container::flat_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_void>_>
             *)local_1a8._M_len;
  if ((uVar9 != 0) && (pcVar10 = (local_1b0->first)._M_str, *pcVar10 == '/')) {
    (local_1b0->first)._M_str = pcVar10 + 1;
    (local_1b0->first)._M_len = uVar9 - 1;
  }
  local_1c8 = (pair<std::basic_string_view<char,_std::char_traits<char>_>,_boost::container::flat_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_void>_>
               *)0x0;
  iStack_1c0._M_current = (basic_string_view<char,_std::char_traits<char>_> *)0x0;
  local_1b8 = (basic_string_view<char,_std::char_traits<char>_> *)0x0;
  if ((pair<std::basic_string_view<char,_std::char_traits<char>_>,_boost::container::flat_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_void>_>
       *)local_1a8._M_len !=
      (pair<std::basic_string_view<char,_std::char_traits<char>_>,_boost::container::flat_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_void>_>
       *)0x0) {
    pvVar3 = memchr(local_1a8._M_str,0x26,local_1a8._M_len);
    ppVar14 = (pair<std::basic_string_view<char,_std::char_traits<char>_>,_boost::container::flat_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_void>_>
               *)((long)pvVar3 - (long)p_Var13);
    if (ppVar14 !=
        (pair<std::basic_string_view<char,_std::char_traits<char>_>,_boost::container::flat_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_void>_>
         *)0xffffffffffffffff && pvVar3 != (void *)0x0) {
      do {
        if (ppVar14 <= ppVar11) {
          ppVar11 = ppVar14;
        }
        local_178._0_8_ = ppVar11;
        local_178._8_8_ = p_Var13;
        if (iStack_1c0._M_current == local_1b8) {
          std::
          vector<std::basic_string_view<char,std::char_traits<char>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
          ::_M_realloc_insert<std::basic_string_view<char,std::char_traits<char>>>
                    ((vector<std::basic_string_view<char,std::char_traits<char>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
                      *)&local_1c8,iStack_1c0,
                     (basic_string_view<char,_std::char_traits<char>_> *)local_178);
        }
        else {
          local_178._0_4_ = SUB84(ppVar11,0);
          local_178._4_4_ = (undefined4)((ulong)ppVar11 >> 0x20);
          local_178._8_4_ = SUB84(p_Var13,0);
          local_178._12_4_ = (undefined4)((ulong)p_Var13 >> 0x20);
          *(undefined4 *)&(iStack_1c0._M_current)->_M_len = local_178._0_4_;
          *(undefined4 *)((long)&(iStack_1c0._M_current)->_M_len + 4) = local_178._4_4_;
          *(undefined4 *)&(iStack_1c0._M_current)->_M_str = local_178._8_4_;
          *(undefined4 *)((long)&(iStack_1c0._M_current)->_M_str + 4) = local_178._12_4_;
          iStack_1c0._M_current = iStack_1c0._M_current + 1;
        }
        pcVar10 = (char *)((long)&(ppVar14->first)._M_len + 1);
        if (local_1a8._M_len <= ppVar14) {
          std::__throw_out_of_range_fmt
                    ("%s: __pos (which is %zu) > __size (which is %zu)","basic_string_view::substr",
                     pcVar10,local_1a8._M_len);
        }
        p_Var13 = (_Base_ptr)(pcVar10 + (long)(_Rb_tree_color *)local_1a8._M_str);
        ppVar11 = (pair<std::basic_string_view<char,_std::char_traits<char>_>,_boost::container::flat_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_void>_>
                   *)(local_1a8._M_len - (long)pcVar10);
        local_1a8._M_len = (size_t)ppVar11;
        local_1a8._M_str = (char *)p_Var13;
      } while (((ppVar11 !=
                 (pair<std::basic_string_view<char,_std::char_traits<char>_>,_boost::container::flat_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_void>_>
                  *)0x0) && (pvVar3 = memchr(p_Var13,0x26,(size_t)ppVar11), pvVar3 != (void *)0x0))
              && (ppVar14 = (pair<std::basic_string_view<char,_std::char_traits<char>_>,_boost::container::flat_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_void>_>
                             *)((long)pvVar3 - (long)p_Var13),
                 ppVar14 !=
                 (pair<std::basic_string_view<char,_std::char_traits<char>_>,_boost::container::flat_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_void>_>
                  *)0xffffffffffffffff));
      if (ppVar11 ==
          (pair<std::basic_string_view<char,_std::char_traits<char>_>,_boost::container::flat_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_void>_>
           *)0x0) goto LAB_001c56ad;
    }
    if (iStack_1c0._M_current == local_1b8) {
      std::
      vector<std::basic_string_view<char,std::char_traits<char>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
      ::_M_realloc_insert<std::basic_string_view<char,std::char_traits<char>>const&>
                ((vector<std::basic_string_view<char,std::char_traits<char>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
                  *)&local_1c8,iStack_1c0,&local_1a8);
    }
    else {
      (iStack_1c0._M_current)->_M_len = local_1a8._M_len;
      (iStack_1c0._M_current)->_M_str = local_1a8._M_str;
      iStack_1c0._M_current = iStack_1c0._M_current + 1;
    }
  }
LAB_001c56ad:
  p_Var13 = (_Base_ptr)local_198._M_str;
  ppVar11 = (pair<std::basic_string_view<char,_std::char_traits<char>_>,_boost::container::flat_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_void>_>
             *)local_198._M_len;
  if ((pair<std::basic_string_view<char,_std::char_traits<char>_>,_boost::container::flat_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_void>_>
       *)local_198._M_len !=
      (pair<std::basic_string_view<char,_std::char_traits<char>_>,_boost::container::flat_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_void>_>
       *)0x0) {
    if ((char)*(_Rb_tree_color *)local_198._M_str == 0x7b) {
      jsonString._M_str = (char *)local_198._M_len;
      jsonString._M_len = (size_t)&local_188;
      helics::fileops::loadJsonStr_abi_cxx11_(jsonString);
      local_a8.container = (pointer)&local_188;
      nlohmann::json_abi_v3_11_3::detail::
      iteration_proxy<nlohmann::json_abi_v3_11_3::detail::iter_impl<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>
      ::begin((iteration_proxy_value<nlohmann::json_abi_v3_11_3::detail::iter_impl<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>
               *)local_178,&local_a8);
      nlohmann::json_abi_v3_11_3::detail::
      iteration_proxy<nlohmann::json_abi_v3_11_3::detail::iter_impl<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>
      ::end((iteration_proxy_value<nlohmann::json_abi_v3_11_3::detail::iter_impl<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>
             *)local_a0,&local_a8);
      this = &local_1b0->second;
      while (bVar2 = nlohmann::json_abi_v3_11_3::detail::
                     iter_impl<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                     ::
                     operator==<nlohmann::json_abi_v3_11_3::detail::iter_impl<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>,_nullptr>
                               ((iter_impl<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                                 *)local_178,
                                (iter_impl<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                                 *)local_a0), !bVar2) {
        pbVar5 = nlohmann::json_abi_v3_11_3::detail::
                 iter_impl<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                 ::operator*((iter_impl<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                              *)local_178);
        if ((pbVar5->m_data).m_type == string) {
          pbVar5 = nlohmann::json_abi_v3_11_3::detail::
                   iter_impl<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                   ::operator*((iter_impl<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                                *)local_178);
          nlohmann::json_abi_v3_11_3::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
          ::
          get_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                    (local_e8,pbVar5);
          psVar6 = nlohmann::json_abi_v3_11_3::detail::
                   iteration_proxy_value<nlohmann::json_abi_v3_11_3::detail::iter_impl<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>
                   ::key((iteration_proxy_value<nlohmann::json_abi_v3_11_3::detail::iter_impl<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>
                          *)local_178);
          boost::container::
          flat_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_void>
          ::priv_subscript(this,psVar6);
          processRequestParameters_abi_cxx11_();
        }
        else {
          pbVar5 = nlohmann::json_abi_v3_11_3::detail::
                   iter_impl<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                   ::operator*((iter_impl<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                                *)local_178);
          helics::fileops::generateJsonString(&local_c8,pbVar5,true);
          psVar6 = nlohmann::json_abi_v3_11_3::detail::
                   iteration_proxy_value<nlohmann::json_abi_v3_11_3::detail::iter_impl<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>
                   ::key((iteration_proxy_value<nlohmann::json_abi_v3_11_3::detail::iter_impl<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>
                          *)local_178);
          boost::container::
          flat_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_void>
          ::priv_subscript(this,psVar6);
          processRequestParameters_abi_cxx11_();
        }
        if (*(char *)local_178._0_8_ == '\x02') {
          local_168[0].first._M_len = local_168[0].first._M_len + 0x10;
        }
        else if (*(char *)local_178._0_8_ == '\x01') {
          local_178._8_8_ = std::_Rb_tree_increment((_Rb_tree_node_base *)local_178._8_8_);
        }
        else {
          local_168[0].first._M_str = (char *)((long)local_168[0].first._M_str + 1);
        }
        local_168[0].second.m_flat_tree.m_data.m_seq.m_holder.m_start =
             (pointer)((long)&((local_168[0].second.m_flat_tree.m_data.m_seq.m_holder.m_start)->
                              first)._M_dataplus._M_p + 1);
      }
      nlohmann::json_abi_v3_11_3::detail::
      iteration_proxy_value<nlohmann::json_abi_v3_11_3::detail::iter_impl<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>
      ::~iteration_proxy_value
                ((iteration_proxy_value<nlohmann::json_abi_v3_11_3::detail::iter_impl<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>
                  *)local_a0);
      nlohmann::json_abi_v3_11_3::detail::
      iteration_proxy_value<nlohmann::json_abi_v3_11_3::detail::iter_impl<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>
      ::~iteration_proxy_value
                ((iteration_proxy_value<nlohmann::json_abi_v3_11_3::detail::iter_impl<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>
                  *)local_178);
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::data::~data(&local_188);
    }
    else {
      pvVar3 = memchr(local_198._M_str,0x26,local_198._M_len);
      ppVar14 = (pair<std::basic_string_view<char,_std::char_traits<char>_>,_boost::container::flat_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_void>_>
                 *)((long)pvVar3 - (long)p_Var13);
      if (ppVar14 !=
          (pair<std::basic_string_view<char,_std::char_traits<char>_>,_boost::container::flat_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_void>_>
           *)0xffffffffffffffff && pvVar3 != (void *)0x0) {
        do {
          if (ppVar14 <= ppVar11) {
            ppVar11 = ppVar14;
          }
          local_178._0_8_ = ppVar11;
          local_178._8_8_ = p_Var13;
          if (iStack_1c0._M_current == local_1b8) {
            std::
            vector<std::basic_string_view<char,std::char_traits<char>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
            ::_M_realloc_insert<std::basic_string_view<char,std::char_traits<char>>>
                      ((vector<std::basic_string_view<char,std::char_traits<char>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
                        *)&local_1c8,iStack_1c0,
                       (basic_string_view<char,_std::char_traits<char>_> *)local_178);
          }
          else {
            local_178._0_4_ = SUB84(ppVar11,0);
            local_178._4_4_ = (undefined4)((ulong)ppVar11 >> 0x20);
            local_178._8_4_ = SUB84(p_Var13,0);
            local_178._12_4_ = (undefined4)((ulong)p_Var13 >> 0x20);
            *(undefined4 *)&(iStack_1c0._M_current)->_M_len = local_178._0_4_;
            *(undefined4 *)((long)&(iStack_1c0._M_current)->_M_len + 4) = local_178._4_4_;
            *(undefined4 *)&(iStack_1c0._M_current)->_M_str = local_178._8_4_;
            *(undefined4 *)((long)&(iStack_1c0._M_current)->_M_str + 4) = local_178._12_4_;
            iStack_1c0._M_current = iStack_1c0._M_current + 1;
          }
          pcVar10 = (char *)((long)&(ppVar14->first)._M_len + 1);
          if (local_198._M_len <= ppVar14) {
            std::__throw_out_of_range_fmt
                      ("%s: __pos (which is %zu) > __size (which is %zu)",
                       "basic_string_view::substr",pcVar10,local_198._M_len);
          }
          p_Var13 = (_Base_ptr)(pcVar10 + (long)(_Rb_tree_color *)local_198._M_str);
          ppVar11 = (pair<std::basic_string_view<char,_std::char_traits<char>_>,_boost::container::flat_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_void>_>
                     *)(local_198._M_len - (long)pcVar10);
          local_198._M_len = (size_t)ppVar11;
          local_198._M_str = (char *)p_Var13;
        } while (((ppVar11 !=
                   (pair<std::basic_string_view<char,_std::char_traits<char>_>,_boost::container::flat_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_void>_>
                    *)0x0) && (pvVar3 = memchr(p_Var13,0x26,(size_t)ppVar11), pvVar3 != (void *)0x0)
                 ) && (ppVar14 = (pair<std::basic_string_view<char,_std::char_traits<char>_>,_boost::container::flat_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_void>_>
                                  *)((long)pvVar3 - (long)p_Var13),
                      ppVar14 !=
                      (pair<std::basic_string_view<char,_std::char_traits<char>_>,_boost::container::flat_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_void>_>
                       *)0xffffffffffffffff));
        if (ppVar11 ==
            (pair<std::basic_string_view<char,_std::char_traits<char>_>,_boost::container::flat_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_void>_>
             *)0x0) goto LAB_001c5904;
      }
      if (iStack_1c0._M_current == local_1b8) {
        std::
        vector<std::basic_string_view<char,std::char_traits<char>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
        ::_M_realloc_insert<std::basic_string_view<char,std::char_traits<char>>const&>
                  ((vector<std::basic_string_view<char,std::char_traits<char>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
                    *)&local_1c8,iStack_1c0,&local_198);
      }
      else {
        (iStack_1c0._M_current)->_M_len = local_198._M_len;
        (iStack_1c0._M_current)->_M_str = local_198._M_str;
        iStack_1c0._M_current = iStack_1c0._M_current + 1;
      }
    }
  }
LAB_001c5904:
  local_100 = (pair<std::basic_string_view<char,_std::char_traits<char>_>,_boost::container::flat_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_void>_>
               *)iStack_1c0._M_current;
  iVar7._M_current = iStack_1c0._M_current;
  if (local_1c8 !=
      (pair<std::basic_string_view<char,_std::char_traits<char>_>,_boost::container::flat_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_void>_>
       *)iStack_1c0._M_current) {
    local_108 = &local_1b0->second;
    ppVar11 = local_1c8;
    do {
      uVar12 = (ppVar11->first)._M_len;
      uVar4 = 0xffffffffffffffff;
      if (uVar12 != 0) {
        pcVar10 = (ppVar11->first)._M_str;
        pvVar3 = memchr(pcVar10,0x3d,uVar12);
        uVar4 = -(ulong)(pvVar3 == (void *)0x0) | (long)pvVar3 - (long)pcVar10;
      }
      uVar9 = uVar4 + 1;
      local_f0 = uVar4;
      if (uVar12 < uVar9) {
        std::__throw_out_of_range_fmt
                  ("%s: __pos (which is %zu) > __size (which is %zu)","basic_string_view::substr",
                   uVar9,uVar12);
      }
      pcVar10 = (ppVar11->first)._M_str;
      local_178._0_8_ = local_168;
      local_178._8_8_ = (_Base_ptr)0x0;
      local_168[0].first._M_len = local_168[0].first._M_len & 0xffffffffffffff00;
      local_f8 = ppVar11;
      if (uVar12 != uVar9) {
        uVar15 = 0;
        do {
          __c = pcVar10[uVar15 + uVar9];
          if (__c == '%') {
            local_188.m_type = pcVar10[uVar15 + uVar4 + 2];
            local_188._1_1_ = pcVar10[uVar15 + uVar4 + 3];
            local_188._2_1_ = 0;
            local_a0._0_8_ = (pointer)0x0;
            uVar8 = strtoul((char *)&local_188,(char **)local_a0,0x10);
            if (local_a0._0_8_ - (long)&local_188 < 2) {
              CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              push_back((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        local_178,pcVar10[uVar15 + uVar9]);
            }
            else {
              CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              push_back((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        local_178,(char)uVar8);
              uVar15 = uVar15 + 2;
            }
          }
          else {
            if (__c == '+') {
              __c = ' ';
            }
            CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            push_back((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_178
                      ,__c);
          }
          uVar15 = uVar15 + 1;
        } while (uVar15 < uVar12 - uVar9);
      }
      ppVar11 = local_f8;
      uVar12 = (local_f8->first)._M_len;
      pcVar10 = (local_f8->first)._M_str;
      uVar4 = local_f0;
      if (uVar12 < local_f0) {
        uVar4 = uVar12;
      }
      local_a0._0_8_ = (pointer)(local_a0 + 0x10);
      std::__cxx11::string::_M_construct<char_const*>((string *)local_a0,pcVar10,pcVar10 + uVar4);
      this_00 = boost::container::
                flat_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_void>
                ::priv_subscript(local_108,(key_type *)local_a0);
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
      operator=(this_00,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        local_178);
      if ((pointer)local_a0._0_8_ != (pointer)(local_a0 + 0x10)) {
        operator_delete((void *)local_a0._0_8_,(ulong)(local_a0._16_8_ + 1));
      }
      iVar7._M_current = &local_168[0].first;
      if ((basic_string_view<char,_std::char_traits<char>_> *)local_178._0_8_ != iVar7._M_current) {
        operator_delete((void *)local_178._0_8_,(ulong)(local_168[0].first._M_len + 1));
        iVar7._M_current = &extraout_RAX->first;
      }
      ppVar11 = (pair<std::basic_string_view<char,_std::char_traits<char>_>,_boost::container::flat_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_void>_>
                 *)&ppVar11->second;
    } while (ppVar11 != local_100);
  }
  if (local_1c8 !=
      (pair<std::basic_string_view<char,_std::char_traits<char>_>,_boost::container::flat_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_void>_>
       *)0x0) {
    operator_delete(local_1c8,(long)local_1b8 - (long)local_1c8);
    iVar7._M_current = &extraout_RAX_00->first;
  }
  return (pair<std::basic_string_view<char,_std::char_traits<char>_>,_boost::container::flat_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_void>_>
          *)iVar7._M_current;
}

Assistant:

static std::pair<std::string_view, boost::container::flat_map<std::string, std::string>>
    processRequestParameters(std::string_view target, std::string_view body)
{
    std::pair<std::string_view, boost::container::flat_map<std::string, std::string>> results;
    auto param_mark = target.find('?');
    if (param_mark != std::string_view::npos) {
        results.first = target.substr(0, param_mark);
        target = target.substr(param_mark + 1);
    } else {
        results.first = target;
        target = std::string_view{};
    }
    if (!results.first.empty() && results.first.front() == '/') {
        results.first.remove_prefix(1);
    }

    std::vector<std::string_view> parameters;
    if (!target.empty()) {
        auto splitloc = target.find_first_of('&');
        while (splitloc != std::string_view::npos) {
            parameters.push_back(target.substr(0, splitloc));
            target = target.substr(splitloc + 1);
            splitloc = target.find_first_of('&');
        }
        if (!target.empty()) {
            parameters.push_back(target);
        }
    }
    if (!body.empty()) {
        if (body.front() == '{') {
            nlohmann::json val = helics::fileops::loadJsonStr(body);
            for (const auto& value : val.items()) {
                if (value.value().is_string()) {
                    results.second[value.key()] = value.value().get<std::string>();
                } else {
                    results.second[value.key()] =
                        helics::fileops::generateJsonString(value.value());
                }
            }
        } else {
            auto splitloc = body.find_first_of('&');
            while (splitloc != std::string_view::npos) {
                parameters.push_back(body.substr(0, splitloc));
                body = body.substr(splitloc + 1);
                splitloc = body.find_first_of('&');
            }
            if (!body.empty()) {
                parameters.push_back(body);
            }
        }
    }

    for (auto& param : parameters) {
        auto eq_loc = param.find_first_of('=');
        results.second[std::string{param.substr(0, eq_loc)}] = uriDecode(param.substr(eq_loc + 1));
    }
    return results;
}